

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O3

size_t rtc::unescape(char *buffer,size_t buflen,char *source,size_t srclen,char escape)

{
  char cVar1;
  size_t sVar2;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  FatalMessage local_188;
  
  if (buffer != (char *)0x0) {
    if (buflen == 0) {
      sVar2 = 0;
    }
    else {
      if (buflen == 1 || srclen == 0) {
        sVar2 = 0;
      }
      else {
        uVar6 = 0;
        sVar4 = 0;
        do {
          cVar1 = source[uVar6];
          uVar5 = uVar6 + 1;
          if (uVar6 + 1 < srclen && cVar1 == escape) {
            cVar1 = source[uVar6 + 1];
            uVar5 = uVar6 + 2;
          }
          uVar6 = uVar5;
          buffer[sVar4] = cVar1;
          sVar2 = sVar4 + 1;
        } while ((uVar6 < srclen) && (uVar5 = sVar4 + 2, sVar4 = sVar2, uVar5 < buflen));
      }
      buffer[sVar2] = '\0';
    }
    return sVar2;
  }
  FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188,"Check failed: buffer",0x14);
  std::ios::widen((char)&local_188 + (char)*(undefined8 *)(local_188._0_8_ + -0x18));
  std::ostream::put((char)&local_188);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
  FatalMessage::~FatalMessage(&local_188);
}

Assistant:

size_t unescape(char * buffer, size_t buflen,
                const char * source, size_t srclen,
                char escape) {
  RTC_DCHECK(buffer);  // TODO(grunell): estimate output size
  if (buflen <= 0)
    return 0;

  size_t srcpos = 0, bufpos = 0;
  while ((srcpos < srclen) && (bufpos + 1 < buflen)) {
    char ch = source[srcpos++];
    if ((ch == escape) && (srcpos < srclen)) {
      ch = source[srcpos++];
    }
    buffer[bufpos++] = ch;
  }
  buffer[bufpos] = '\0';
  return bufpos;
}